

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

void __thiscall FGUIDCVar::SetGenericRepDefault(FGUIDCVar *this,UCVarValue value,ECVarType type)

{
  WORD WVar1;
  WORD WVar2;
  GUID *pGVar3;
  GUID *guid;
  ECVarType type_local;
  FGUIDCVar *this_local;
  UCVarValue value_local;
  
  pGVar3 = FBaseCVar::ToGUID(value,type);
  if (pGVar3 != (GUID *)0x0) {
    WVar1 = pGVar3->Data2;
    WVar2 = pGVar3->Data3;
    (this->Value).Data1 = pGVar3->Data1;
    (this->Value).Data2 = WVar1;
    (this->Value).Data3 = WVar2;
    *(undefined8 *)(this->Value).Data4 = *(undefined8 *)pGVar3->Data4;
    if (((this->super_FBaseCVar).Flags & 0x80) != 0) {
      FBaseCVar::SetGenericRep(&this->super_FBaseCVar,value,type);
      (this->super_FBaseCVar).Flags = (this->super_FBaseCVar).Flags | 0x80;
    }
  }
  return;
}

Assistant:

void FGUIDCVar::SetGenericRepDefault (UCVarValue value, ECVarType type)
{
	const GUID *guid = ToGUID (value, type);
	if (guid != NULL)
	{
		Value = *guid;
		if (Flags & CVAR_ISDEFAULT)
		{
			SetGenericRep (value, type);
			Flags |= CVAR_ISDEFAULT;
		}
	}
}